

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
      *this)

{
  double dVar1;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar5;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar6;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar7;
  double dVar8;
  double dVar9;
  
  pFVar2 = (this->left_->fadexpr_).expr_;
  pFVar3 = (pFVar2->fadexpr_).expr_.fadexpr_.left_;
  dVar8 = cos(((pFVar3->fadexpr_).left_.constant_ * ((pFVar3->fadexpr_).right_)->val_) /
              (pFVar2->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar4 = this->right_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  dVar1 = (pFVar5->fadexpr_).left_.constant_;
  pFVar6 = (pFVar5->fadexpr_).right_;
  dVar9 = sin((pFVar6->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((pFVar6->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar7 = (pFVar4->fadexpr_).right_;
  pFVar3 = (pFVar7->fadexpr_).left_;
  return (dVar9 * dVar1 +
         ((pFVar3->fadexpr_).left_.constant_ * ((pFVar3->fadexpr_).right_)->val_) /
         (pFVar7->fadexpr_).right_.constant_) * -dVar8;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}